

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shared.h
# Opt level: O2

SmartObject * __thiscall asl::SmartObject::operator=(SmartObject *this,SmartObject *n)

{
  SmartObject_ *pSVar1;
  
  unref(this);
  pSVar1 = n->_p;
  this->_p = pSVar1;
  if (pSVar1 != (SmartObject_ *)0x0) {
    LOCK();
    (pSVar1->rc).n = (pSVar1->rc).n + 1;
    UNLOCK();
  }
  return this;
}

Assistant:

SmartObject& operator=(const SmartObject& n)
	{
		unref();
		_p = n._p;
		if (_p)
			++_p->rc;
		return *this;
	}